

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

uint8_t av1_findSamples(AV1_COMMON *cm,MACROBLOCKD *xd,int *pts,int *pts_inref)

{
  char cVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  int mi_col;
  MB_MODE_INFO *pMVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int i;
  int iVar11;
  byte bVar12;
  byte bVar13;
  POSITION trb_pos;
  
  cVar1 = (*xd->mi)->ref_frame[0];
  _Var2 = xd->up_available;
  _Var3 = xd->left_available;
  uVar4 = xd->mi_stride;
  iVar9 = xd->mi_row;
  mi_col = xd->mi_col;
  bVar7 = true;
  if (_Var2 == true) {
    pMVar5 = xd->mi[-(long)(int)uVar4];
    bVar12 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [pMVar5->bsize];
    bVar13 = xd->width;
    if (bVar12 < bVar13) {
      iVar11 = 0;
      bVar12 = 0;
      while( true ) {
        uVar10 = (cm->mi_params).mi_cols - mi_col;
        if ((int)(uint)bVar13 <= (int)uVar10) {
          uVar10 = (uint)bVar13;
        }
        if ((int)uVar10 <= iVar11) break;
        pMVar5 = xd->mi[(int)(iVar11 - uVar4)];
        bVar8 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [pMVar5->bsize];
        if ((pMVar5->ref_frame[0] == cVar1) && (pMVar5->ref_frame[1] == -1)) {
          record_samples(pMVar5,pts,pts_inref,0,-1,iVar11,1);
          bVar12 = bVar12 + 1;
          if (7 < bVar12) {
            return '\b';
          }
          pts_inref = pts_inref + 2;
          pts = pts + 2;
          bVar13 = xd->width;
        }
        iVar11 = iVar11 + (uint)bVar8;
      }
      bVar6 = true;
      bVar7 = true;
    }
    else {
      iVar11 = mi_col % (int)(uint)bVar12;
      bVar6 = iVar11 < 1;
      bVar7 = (int)((uint)bVar12 - iVar11) <= (int)(uint)bVar13;
      if ((pMVar5->ref_frame[0] == cVar1) && (pMVar5->ref_frame[1] == -1)) {
        record_samples(pMVar5,pts,pts_inref,0,-1,-iVar11,1);
        pts = pts + 2;
        pts_inref = pts_inref + 2;
        bVar12 = 1;
      }
      else {
        bVar12 = 0;
      }
    }
  }
  else {
    bVar12 = 0;
    bVar6 = true;
  }
  if (_Var3 != false) {
    pMVar5 = xd->mi[-1];
    bVar13 = xd->height;
    if ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[pMVar5->bsize]
        < bVar13) {
      iVar11 = 0;
      while( true ) {
        uVar10 = (cm->mi_params).mi_rows - iVar9;
        if ((int)(uint)bVar13 <= (int)uVar10) {
          uVar10 = (uint)bVar13;
        }
        if ((int)uVar10 <= iVar11) break;
        pMVar5 = xd->mi[(long)(int)(iVar11 * uVar4) + -1];
        bVar8 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                [pMVar5->bsize];
        if ((pMVar5->ref_frame[0] == cVar1) && (pMVar5->ref_frame[1] == -1)) {
          record_samples(pMVar5,pts,pts_inref,iVar11,1,0,-1);
          bVar12 = bVar12 + 1;
          if (7 < bVar12) {
            return '\b';
          }
          pts_inref = pts_inref + 2;
          pts = pts + 2;
          bVar13 = xd->height;
        }
        iVar11 = iVar11 + (uint)bVar8;
      }
    }
    else {
      iVar11 = iVar9 % (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                  [pMVar5->bsize];
      if (0 < iVar11) {
        bVar6 = false;
      }
      if ((pMVar5->ref_frame[0] == cVar1) && (pMVar5->ref_frame[1] == -1)) {
        record_samples(pMVar5,pts,pts_inref,-iVar11,1,0,-1);
        bVar12 = bVar12 + 1;
        if (7 < bVar12) {
          return '\b';
        }
        pts = pts + 2;
        pts_inref = pts_inref + 2;
      }
    }
    if (((bVar6 && _Var2 == true) && (pMVar5 = xd->mi[(int)~uVar4], pMVar5->ref_frame[0] == cVar1))
       && (pMVar5->ref_frame[1] == -1)) {
      record_samples(pMVar5,pts,pts_inref,0,-1,0,-1);
      bVar12 = bVar12 + 1;
      if (7 < bVar12) {
        return '\b';
      }
      pts = pts + 2;
      pts_inref = pts_inref + 2;
    }
  }
  if (bVar7) {
    bVar13 = xd->width;
    uVar10 = (uint)bVar13;
    bVar8 = xd->height;
    if (xd->height < bVar13) {
      bVar8 = bVar13;
    }
    iVar11 = has_top_right(cm,xd,iVar9,mi_col,(uint)bVar8);
    if (iVar11 != 0) {
      trb_pos.row = -1;
      trb_pos.col = uVar10;
      iVar9 = is_inside(&xd->tile,mi_col,iVar9,&trb_pos);
      if (((iVar9 != 0) && (pMVar5 = xd->mi[(int)(uVar10 - uVar4)], pMVar5->ref_frame[0] == cVar1))
         && (pMVar5->ref_frame[1] == -1)) {
        record_samples(pMVar5,pts,pts_inref,0,-1,uVar10,1);
        bVar13 = bVar12 + 1;
        bVar12 = 8;
        if (bVar13 < 8) {
          bVar12 = bVar13;
        }
      }
    }
  }
  return bVar12;
}

Assistant:

uint8_t av1_findSamples(const AV1_COMMON *cm, MACROBLOCKD *xd, int *pts,
                        int *pts_inref) {
  const MB_MODE_INFO *const mbmi0 = xd->mi[0];
  const int ref_frame = mbmi0->ref_frame[0];
  const int up_available = xd->up_available;
  const int left_available = xd->left_available;
  uint8_t np = 0;
  int do_tl = 1;
  int do_tr = 1;
  const int mi_stride = xd->mi_stride;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // scan the nearest above rows
  if (up_available) {
    const int mi_row_offset = -1;
    const MB_MODE_INFO *mbmi = xd->mi[mi_row_offset * mi_stride];
    uint8_t superblock_width = mi_size_wide[mbmi->bsize];

    if (xd->width <= superblock_width) {
      // Handle "current block width <= above block width" case.
      const int col_offset = -mi_col % superblock_width;

      if (col_offset < 0) do_tl = 0;
      if (col_offset + superblock_width > xd->width) do_tr = 0;

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, 0, -1, col_offset, 1);
        pts += 2;
        pts_inref += 2;
        if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    } else {
      // Handle "current block width > above block width" case.
      for (int i = 0; i < AOMMIN(xd->width, cm->mi_params.mi_cols - mi_col);
           i += superblock_width) {
        mbmi = xd->mi[i + mi_row_offset * mi_stride];
        superblock_width = mi_size_wide[mbmi->bsize];

        if (mbmi->ref_frame[0] == ref_frame &&
            mbmi->ref_frame[1] == NONE_FRAME) {
          record_samples(mbmi, pts, pts_inref, 0, -1, i, 1);
          pts += 2;
          pts_inref += 2;
          if (++np >= LEAST_SQUARES_SAMPLES_MAX)
            return LEAST_SQUARES_SAMPLES_MAX;
        }
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // scan the nearest left columns
  if (left_available) {
    const int mi_col_offset = -1;
    const MB_MODE_INFO *mbmi = xd->mi[mi_col_offset];
    uint8_t superblock_height = mi_size_high[mbmi->bsize];

    if (xd->height <= superblock_height) {
      // Handle "current block height <= above block height" case.
      const int row_offset = -mi_row % superblock_height;

      if (row_offset < 0) do_tl = 0;

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, row_offset, 1, 0, -1);
        pts += 2;
        pts_inref += 2;
        np++;
        if (np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    } else {
      // Handle "current block height > above block height" case.
      for (int i = 0; i < AOMMIN(xd->height, cm->mi_params.mi_rows - mi_row);
           i += superblock_height) {
        mbmi = xd->mi[mi_col_offset + i * mi_stride];
        superblock_height = mi_size_high[mbmi->bsize];

        if (mbmi->ref_frame[0] == ref_frame &&
            mbmi->ref_frame[1] == NONE_FRAME) {
          record_samples(mbmi, pts, pts_inref, i, 1, 0, -1);
          pts += 2;
          pts_inref += 2;
          if (++np >= LEAST_SQUARES_SAMPLES_MAX)
            return LEAST_SQUARES_SAMPLES_MAX;
        }
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // Top-left block
  if (do_tl && left_available && up_available) {
    const int mi_row_offset = -1;
    const int mi_col_offset = -1;
    MB_MODE_INFO *mbmi = xd->mi[mi_col_offset + mi_row_offset * mi_stride];

    if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
      record_samples(mbmi, pts, pts_inref, 0, -1, 0, -1);
      pts += 2;
      pts_inref += 2;
      if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  // Top-right block
  if (do_tr &&
      has_top_right(cm, xd, mi_row, mi_col, AOMMAX(xd->width, xd->height))) {
    const POSITION trb_pos = { -1, xd->width };
    const TileInfo *const tile = &xd->tile;
    if (is_inside(tile, mi_col, mi_row, &trb_pos)) {
      const int mi_row_offset = -1;
      const int mi_col_offset = xd->width;
      const MB_MODE_INFO *mbmi =
          xd->mi[mi_col_offset + mi_row_offset * mi_stride];

      if (mbmi->ref_frame[0] == ref_frame && mbmi->ref_frame[1] == NONE_FRAME) {
        record_samples(mbmi, pts, pts_inref, 0, -1, xd->width, 1);
        if (++np >= LEAST_SQUARES_SAMPLES_MAX) return LEAST_SQUARES_SAMPLES_MAX;
      }
    }
  }
  assert(np <= LEAST_SQUARES_SAMPLES_MAX);

  return np;
}